

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void helper_mac_set_flags_m68k(CPUM68KState_conflict *env,uint32_t acc)

{
  ulong uVar1;
  uint64_t val;
  uint32_t acc_local;
  CPUM68KState_conflict *env_local;
  
  uVar1 = env->macc[acc];
  if (uVar1 == 0) {
    env->macsr = env->macsr | 4;
  }
  else if ((uVar1 & 0x800000000000) != 0) {
    env->macsr = env->macsr | 8;
  }
  if ((env->macsr & 0x100 << ((byte)acc & 0x1f)) != 0) {
    env->macsr = env->macsr | 2;
  }
  if ((env->macsr & 0x20) == 0) {
    if ((env->macsr & 0x40) == 0) {
      if (uVar1 >> 0x20 != 0) {
        env->macsr = env->macsr | 1;
      }
    }
    else if (((long)uVar1 >> 0x20 != 0) && ((long)uVar1 >> 0x20 != -1)) {
      env->macsr = env->macsr | 1;
    }
  }
  else if (((long)uVar1 >> 0x28 != 0) && ((long)uVar1 >> 0x28 != -1)) {
    env->macsr = env->macsr | 1;
  }
  return;
}

Assistant:

void HELPER(mac_set_flags)(CPUM68KState *env, uint32_t acc)
{
    uint64_t val;
    val = env->macc[acc];
    if (val == 0) {
        env->macsr |= MACSR_Z;
    } else if (val & (1ull << 47)) {
        env->macsr |= MACSR_N;
    }
    if (env->macsr & (MACSR_PAV0 << acc)) {
        env->macsr |= MACSR_V;
    }
    if (env->macsr & MACSR_FI) {
        val = ((int64_t)val) >> 40;
        if (val != 0 && val != -1)
            env->macsr |= MACSR_EV;
    } else if (env->macsr & MACSR_SU) {
        val = ((int64_t)val) >> 32;
        if (val != 0 && val != -1)
            env->macsr |= MACSR_EV;
    } else {
        if ((val >> 32) != 0)
            env->macsr |= MACSR_EV;
    }
}